

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

bool __thiscall QXmlStreamReaderPrivate::scanNData(QXmlStreamReaderPrivate *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  uint *__ptr;
  long lVar4;
  long lVar5;
  
  qVar3 = fastScanSpace(this);
  if (qVar3 != 0) {
    bVar2 = scanString(this,"NDATA",0x24,true);
    if (bVar2) {
      return true;
    }
    __ptr = (this->putStack).data;
    lVar5 = (this->putStack).tos;
    lVar4 = lVar5 + 1;
    lVar1 = (this->putStack).cap;
    if (lVar1 <= lVar4) {
      lVar5 = lVar5 + 2;
      lVar4 = lVar1 * 2;
      if (lVar5 != lVar4 && SBORROW8(lVar5,lVar4) == lVar5 + lVar1 * -2 < 0) {
        lVar4 = lVar5;
      }
      (this->putStack).cap = lVar4;
      __ptr = (uint *)realloc(__ptr,lVar4 << 2);
      (this->putStack).data = __ptr;
      if (__ptr == (uint *)0x0) {
        qBadAlloc();
      }
      lVar4 = (this->putStack).tos + 1;
    }
    (this->putStack).tos = lVar4;
    __ptr[lVar4] = 0x20;
  }
  return false;
}

Assistant:

bool QXmlStreamReaderPrivate::scanNData()
{
    if (fastScanSpace()) {
        if (scanString(spell[NDATA], NDATA))
            return true;
        putChar(' ');
    }
    return false;
}